

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

bool __thiscall
el::base::utils::
AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
::operator!=(AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
             *this,AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                   *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  undefined8 *puVar12;
  bool bVar13;
  undefined8 uVar6;
  
  iVar4 = (*(this->super_ThreadSafe)._vptr_ThreadSafe[10])();
  iVar5 = (*(other->super_ThreadSafe)._vptr_ThreadSafe[10])(other);
  bVar13 = true;
  if (CONCAT44(extraout_var,iVar4) == CONCAT44(extraout_var_00,iVar5)) {
    lVar7 = *(long *)&this->field_0x18 - *(long *)&this->m_list;
    if (lVar7 == 0) {
      bVar13 = false;
    }
    else {
      uVar8 = lVar7 >> 3;
      uVar9 = *(long *)&other->field_0x18 - *(long *)&other->m_list >> 3;
      uVar11 = 0;
      do {
        if (uVar9 == uVar11) {
          pcVar10 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          uVar6 = ::std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar9);
          uVar3 = (undefined1)uVar6;
          puVar1 = *(undefined8 **)pcVar10;
          puVar2 = *(undefined8 **)((long)pcVar10 + 8);
          puVar12 = puVar1;
          if (puVar2 != puVar1) {
            do {
              if ((undefined8 *)*puVar12 != puVar12 + 2) {
                operator_delete((undefined8 *)*puVar12);
                uVar6 = extraout_RAX;
              }
              uVar3 = (undefined1)uVar6;
              puVar12 = puVar12 + 4;
            } while (puVar12 != puVar2);
            *(undefined8 **)((long)pcVar10 + 8) = puVar1;
          }
          return (bool)uVar3;
        }
        if (*(long *)(*(long *)&this->m_list + uVar11 * 8) !=
            *(long *)(*(long *)&other->m_list + uVar11 * 8)) {
          return true;
        }
        uVar11 = uVar11 + 1;
      } while (uVar8 + (uVar8 == 0) != uVar11);
      bVar13 = uVar11 < uVar8;
    }
  }
  return bVar13;
}

Assistant:

bool operator!=(const AbstractRegistry<T_Ptr, Container>& other) {
    if (size() != other.size()) {
      return true;
    }
    for (std::size_t i = 0; i < m_list.size(); ++i) {
      if (m_list.at(i) != other.m_list.at(i)) {
        return true;
      }
    }
    return false;
  }